

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occludedCoherent(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  AccelData *pAVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  uint uVar22;
  RayK<4> *pRVar23;
  RayK<4> *pRVar24;
  Geometry *pGVar25;
  undefined4 uVar26;
  ulong uVar27;
  RayK<4> *pRVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  vint4 ai_2;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar50 [64];
  vint4 bi;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  vint4 bi_10;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  vint4 ai;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  vint4 bi_2;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [64];
  vint4 bi_3;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  vint4 bi_5;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 in_ZMM13 [64];
  uint uVar91;
  uint uVar92;
  vint4 ai_4;
  undefined1 auVar90 [16];
  uint uVar93;
  vint4 bi_4;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  StackItemMaskT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1268 [16];
  undefined1 local_1248 [8];
  float fStack_1240;
  float fStack_123c;
  undefined1 local_11c8 [16];
  float local_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  float local_11a8;
  float fStack_11a4;
  float fStack_11a0;
  float fStack_119c;
  float local_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  undefined1 local_1178 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 local_1168;
  undefined1 local_1158 [16];
  undefined1 local_1148 [16];
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined1 local_1118 [16];
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [8];
  float fStack_1030;
  float fStack_102c;
  undefined1 local_1028 [8];
  float fStack_1020;
  float fStack_101c;
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [8];
  float fStack_ff0;
  float fStack_fec;
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [8];
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [8];
  float fStack_fb0;
  float fStack_fac;
  undefined1 local_fa8 [16];
  undefined1 local_f98 [8];
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [16];
  Geometry *local_f78;
  ulong local_f70;
  RayK<4> local_f68 [3896];
  
  local_1168 = valid_i->field_0;
  auVar37 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  auVar37 = vpcmpeqd_avx((undefined1  [16])local_1168,auVar37);
  uVar22 = vmovmskps_avx(auVar37);
  if (uVar22 == 0) {
    return;
  }
  pAVar6 = This->ptr;
  uVar27 = (ulong)(uVar22 & 0xff);
  auVar52 = vpcmpeqd_avx(in_ZMM13._0_16_,in_ZMM13._0_16_);
  auVar60 = *(undefined1 (*) [16])ray;
  auVar3 = *(undefined1 (*) [16])(ray + 0x10);
  auVar4 = *(undefined1 (*) [16])(ray + 0x20);
  auVar5 = *(undefined1 (*) [16])(ray + 0x40);
  auVar74._8_4_ = 0x7fffffff;
  auVar74._0_8_ = 0x7fffffff7fffffff;
  auVar74._12_4_ = 0x7fffffff;
  auVar49 = vandps_avx(auVar74,auVar5);
  auVar63._8_4_ = 0x219392ef;
  auVar63._0_8_ = 0x219392ef219392ef;
  auVar63._12_4_ = 0x219392ef;
  auVar49 = vcmpps_avx(auVar49,auVar63,1);
  auVar61 = vblendvps_avx(auVar5,auVar63,auVar49);
  auVar49 = *(undefined1 (*) [16])(ray + 0x50);
  auVar62 = vandps_avx(auVar74,auVar49);
  auVar62 = vcmpps_avx(auVar62,auVar63,1);
  auVar66 = vblendvps_avx(auVar49,auVar63,auVar62);
  auVar62 = *(undefined1 (*) [16])(ray + 0x60);
  auVar51 = vandps_avx(auVar62,auVar74);
  auVar51 = vcmpps_avx(auVar51,auVar63,1);
  auVar51 = vblendvps_avx(auVar62,auVar63,auVar51);
  auVar63 = vrcpps_avx(auVar61);
  fVar8 = auVar63._0_4_;
  auVar65._0_4_ = auVar61._0_4_ * fVar8;
  fVar9 = auVar63._4_4_;
  auVar65._4_4_ = auVar61._4_4_ * fVar9;
  fVar10 = auVar63._8_4_;
  auVar65._8_4_ = auVar61._8_4_ * fVar10;
  fVar11 = auVar63._12_4_;
  auVar65._12_4_ = auVar61._12_4_ * fVar11;
  auVar87._8_4_ = 0x3f800000;
  auVar87._0_8_ = 0x3f8000003f800000;
  auVar87._12_4_ = 0x3f800000;
  auVar61 = vsubps_avx(auVar87,auVar65);
  auVar64._0_4_ = fVar8 + fVar8 * auVar61._0_4_;
  auVar64._4_4_ = fVar9 + fVar9 * auVar61._4_4_;
  auVar64._8_4_ = fVar10 + fVar10 * auVar61._8_4_;
  auVar64._12_4_ = fVar11 + fVar11 * auVar61._12_4_;
  auVar61 = vrcpps_avx(auVar66);
  fVar8 = auVar61._0_4_;
  auVar67._0_4_ = auVar66._0_4_ * fVar8;
  fVar9 = auVar61._4_4_;
  auVar67._4_4_ = auVar66._4_4_ * fVar9;
  fVar10 = auVar61._8_4_;
  auVar67._8_4_ = auVar66._8_4_ * fVar10;
  fVar11 = auVar61._12_4_;
  auVar67._12_4_ = auVar66._12_4_ * fVar11;
  auVar61 = vsubps_avx(auVar87,auVar67);
  auVar66._0_4_ = auVar61._0_4_ * fVar8 + fVar8;
  auVar66._4_4_ = auVar61._4_4_ * fVar9 + fVar9;
  auVar66._8_4_ = auVar61._8_4_ * fVar10 + fVar10;
  auVar66._12_4_ = auVar61._12_4_ * fVar11 + fVar11;
  auVar61 = vrcpps_avx(auVar51);
  fVar8 = auVar61._0_4_;
  auVar75._0_4_ = auVar51._0_4_ * fVar8;
  fVar9 = auVar61._4_4_;
  auVar75._4_4_ = auVar51._4_4_ * fVar9;
  fVar10 = auVar61._8_4_;
  auVar75._8_4_ = auVar51._8_4_ * fVar10;
  fVar11 = auVar61._12_4_;
  auVar75._12_4_ = auVar51._12_4_ * fVar11;
  auVar51 = vsubps_avx(auVar87,auVar75);
  auVar68._0_4_ = fVar8 + fVar8 * auVar51._0_4_;
  auVar68._4_4_ = fVar9 + fVar9 * auVar51._4_4_;
  auVar68._8_4_ = fVar10 + fVar10 * auVar51._8_4_;
  auVar68._12_4_ = fVar11 + fVar11 * auVar51._12_4_;
  auVar63 = ZEXT816(0);
  local_1148 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar63);
  local_1158 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar63);
  auVar83 = ZEXT1664(auVar52 ^ auVar37);
  auVar5 = vcmpps_avx(auVar5,auVar63,1);
  auVar51._8_4_ = 1;
  auVar51._0_8_ = 0x100000001;
  auVar51._12_4_ = 1;
  auVar5 = vandps_avx(auVar5,auVar51);
  auVar49 = vcmpps_avx(auVar49,auVar63,1);
  auVar61._8_4_ = 2;
  auVar61._0_8_ = 0x200000002;
  auVar61._12_4_ = 2;
  auVar49 = vandps_avx(auVar49,auVar61);
  auVar49 = vorps_avx(auVar49,auVar5);
  auVar5 = vcmpps_avx(auVar62,auVar63,1);
  auVar62._8_4_ = 4;
  auVar62._0_8_ = 0x400000004;
  auVar62._12_4_ = 4;
  auVar5 = vandps_avx(auVar5,auVar62);
  auVar37 = vpor_avx(auVar52 ^ auVar37,auVar5);
  local_1178 = vpor_avx(auVar37,auVar49);
  pRVar28 = ray;
LAB_00edd086:
  lVar31 = 0;
  if (uVar27 != 0) {
    for (; (uVar27 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
    }
  }
  uVar26 = *(undefined4 *)(local_1178 + lVar31 * 4);
  auVar37._4_4_ = uVar26;
  auVar37._0_4_ = uVar26;
  auVar37._8_4_ = uVar26;
  auVar37._12_4_ = uVar26;
  local_11c8 = vpcmpeqd_avx(auVar37,local_1178);
  uVar26 = vmovmskps_avx(local_11c8);
  local_f70 = CONCAT44((int)((ulong)pRVar28 >> 0x20),uVar26);
  pGVar25 = *(Geometry **)&pAVar6[1].bounds.bounds0.lower.field_0;
  local_f78 = pGVar25;
  uVar27 = ~local_f70 & uVar27;
  auVar94._8_4_ = 0x7f800000;
  auVar94._0_8_ = 0x7f8000007f800000;
  auVar94._12_4_ = 0x7f800000;
  auVar37 = vblendvps_avx(auVar94,auVar60,local_11c8);
  auVar5 = vshufps_avx(auVar37,auVar37,0xb1);
  auVar37 = vminps_avx(auVar5,auVar37);
  auVar5 = vshufpd_avx(auVar37,auVar37,1);
  auVar5 = vminps_avx(auVar5,auVar37);
  auVar37 = vblendvps_avx(auVar94,auVar3,local_11c8);
  auVar49 = vshufps_avx(auVar37,auVar37,0xb1);
  auVar37 = vminps_avx(auVar49,auVar37);
  auVar49 = vshufpd_avx(auVar37,auVar37,1);
  auVar49 = vminps_avx(auVar49,auVar37);
  auVar37 = vblendvps_avx(auVar94,auVar4,local_11c8);
  auVar5 = vinsertps_avx(auVar5,auVar49,0x1c);
  auVar49 = vshufps_avx(auVar37,auVar37,0xb1);
  auVar37 = vminps_avx(auVar49,auVar37);
  auVar49 = vshufpd_avx(auVar37,auVar37,1);
  auVar37 = vminps_avx(auVar49,auVar37);
  auVar62 = vinsertps_avx(auVar5,auVar37,0x20);
  auVar90._8_4_ = 0xff800000;
  auVar90._0_8_ = 0xff800000ff800000;
  auVar90._12_4_ = 0xff800000;
  auVar37 = vblendvps_avx(auVar90,auVar60,local_11c8);
  auVar5 = vshufps_avx(auVar37,auVar37,0xb1);
  auVar37 = vmaxps_avx(auVar5,auVar37);
  auVar5 = vshufpd_avx(auVar37,auVar37,1);
  auVar5 = vmaxps_avx(auVar5,auVar37);
  auVar37 = vblendvps_avx(auVar90,auVar3,local_11c8);
  auVar49 = vshufps_avx(auVar37,auVar37,0xb1);
  auVar37 = vmaxps_avx(auVar49,auVar37);
  auVar49 = vshufpd_avx(auVar37,auVar37,1);
  auVar49 = vmaxps_avx(auVar49,auVar37);
  auVar37 = vblendvps_avx(auVar90,auVar4,local_11c8);
  auVar5 = vinsertps_avx(auVar5,auVar49,0x1c);
  auVar49 = vshufps_avx(auVar37,auVar37,0xb1);
  auVar37 = vmaxps_avx(auVar49,auVar37);
  auVar49 = vshufpd_avx(auVar37,auVar37,1);
  auVar37 = vmaxps_avx(auVar49,auVar37);
  auVar61 = vinsertps_avx(auVar5,auVar37,0x20);
  auVar37 = vblendvps_avx(auVar94,auVar64,local_11c8);
  auVar5 = vshufps_avx(auVar37,auVar37,0xb1);
  auVar37 = vminps_avx(auVar5,auVar37);
  auVar5 = vshufpd_avx(auVar37,auVar37,1);
  auVar5 = vminps_avx(auVar5,auVar37);
  auVar37 = vblendvps_avx(auVar94,auVar66,local_11c8);
  auVar49 = vshufps_avx(auVar37,auVar37,0xb1);
  auVar37 = vminps_avx(auVar49,auVar37);
  auVar49 = vshufpd_avx(auVar37,auVar37,1);
  auVar49 = vminps_avx(auVar49,auVar37);
  auVar37 = vblendvps_avx(auVar94,auVar68,local_11c8);
  auVar5 = vinsertps_avx(auVar5,auVar49,0x1c);
  auVar49 = vshufps_avx(auVar37,auVar37,0xb1);
  auVar37 = vminps_avx(auVar49,auVar37);
  auVar49 = vshufpd_avx(auVar37,auVar37,1);
  auVar37 = vminps_avx(auVar49,auVar37);
  auVar52 = vinsertps_avx(auVar5,auVar37,0x20);
  auVar37 = vblendvps_avx(auVar90,auVar64,local_11c8);
  auVar5 = vshufps_avx(auVar37,auVar37,0xb1);
  auVar37 = vmaxps_avx(auVar5,auVar37);
  auVar5 = vshufpd_avx(auVar37,auVar37,1);
  auVar5 = vmaxps_avx(auVar5,auVar37);
  auVar37 = vblendvps_avx(auVar90,auVar66,local_11c8);
  auVar49 = vshufps_avx(auVar37,auVar37,0xb1);
  auVar37 = vmaxps_avx(auVar49,auVar37);
  auVar49 = vshufpd_avx(auVar37,auVar37,1);
  auVar49 = vmaxps_avx(auVar49,auVar37);
  auVar37 = vblendvps_avx(auVar90,auVar68,local_11c8);
  auVar5 = vinsertps_avx(auVar5,auVar49,0x1c);
  auVar49 = vshufps_avx(auVar37,auVar37,0xb1);
  auVar37 = vmaxps_avx(auVar49,auVar37);
  auVar49 = vshufpd_avx(auVar37,auVar37,1);
  auVar37 = vmaxps_avx(auVar49,auVar37);
  auVar63 = vinsertps_avx(auVar5,auVar37,0x20);
  local_f88 = vblendvps_avx(auVar94,local_1148,local_11c8);
  auVar37 = vshufps_avx(local_f88,local_f88,0xb1);
  auVar65 = vminps_avx(auVar37,local_f88);
  auVar37 = vblendvps_avx(auVar90,local_1158,local_11c8);
  auVar67 = vshufps_avx(auVar37,auVar37,0xb1);
  auVar51 = vcmpps_avx(auVar52,ZEXT816(0) << 0x20,5);
  auVar5 = vblendvps_avx(auVar63,auVar52,auVar51);
  auVar49 = vblendvps_avx(auVar62,auVar61,auVar51);
  auVar62 = vblendvps_avx(auVar61,auVar62,auVar51);
  auVar61 = vmaxps_avx(auVar67,auVar37);
  auVar67 = vmovshdup_avx(auVar5);
  uVar34 = (ulong)(auVar67._0_4_ < 0.0) << 4 | 0x20;
  auVar67 = vshufpd_avx(auVar5,auVar5,1);
  uVar30 = (ulong)(auVar67._0_4_ < 0.0) << 4 | 0x40;
  auVar51 = vblendvps_avx(auVar52,auVar63,auVar51);
  auVar52._0_4_ = auVar5._0_4_ * auVar49._0_4_;
  auVar52._4_4_ = auVar5._4_4_ * auVar49._4_4_;
  auVar52._8_4_ = auVar5._8_4_ * auVar49._8_4_;
  auVar52._12_4_ = auVar5._12_4_ * auVar49._12_4_;
  auVar76._0_4_ = auVar62._0_4_ * auVar51._0_4_;
  auVar76._4_4_ = auVar62._4_4_ * auVar51._4_4_;
  auVar76._8_4_ = auVar62._8_4_ * auVar51._8_4_;
  auVar76._12_4_ = auVar62._12_4_ * auVar51._12_4_;
  uVar29 = (ulong)(auVar5._0_4_ < 0.0) * 0x10;
  _local_f98 = vshufps_avx(auVar5,auVar5,0);
  local_fa8 = vshufps_avx(auVar52,auVar52,0);
  _local_fb8 = vshufps_avx(auVar5,auVar5,0x55);
  local_fc8 = vshufps_avx(auVar52,auVar52,0x55);
  _local_fd8 = vshufps_avx(auVar5,auVar5,0xaa);
  local_fe8 = vshufps_avx(auVar52,auVar52,0xaa);
  _local_ff8 = vshufps_avx(auVar51,auVar51,0);
  local_1008 = vshufps_avx(auVar76,auVar76,0);
  auVar5 = vshufps_avx(auVar65,auVar65,0);
  auVar49 = vshufps_avx(auVar65,auVar65,0xaa);
  auVar5 = vminps_avx(auVar49,auVar5);
  auVar49 = vshufps_avx(auVar61,auVar61,0);
  auVar62 = vshufps_avx(auVar61,auVar61,0xaa);
  local_1018 = vmaxps_avx(auVar62,auVar49);
  _local_1028 = vshufps_avx(auVar51,auVar51,0x55);
  _local_1038 = vshufps_avx(auVar51,auVar51,0xaa);
  local_1048 = vshufps_avx(auVar76,auVar76,0x55);
  local_1058 = vshufps_avx(auVar76,auVar76,0xaa);
  auVar83 = ZEXT1664(auVar83._0_16_);
  pRVar24 = local_f68;
  auVar49 = local_1058;
LAB_00edd3ed:
  auVar50 = ZEXT1664(auVar49);
  auVar49 = auVar83._0_16_;
  uVar26 = vmovmskps_avx(auVar49);
  pRVar23 = pRVar24;
  do {
    pRVar28 = (RayK<4> *)&local_f78;
    auVar62 = auVar50._0_16_;
    if (pRVar23 == pRVar28) goto LAB_00eddaae;
    pRVar24 = pRVar23 + -0x10;
    pRVar28 = pRVar23 + -8;
    pRVar23 = pRVar24;
    if ((*(ulong *)pRVar28 & ~CONCAT44((int)((ulong)pGVar25 >> 0x20),uVar26)) != 0) {
      pRVar28 = (RayK<4> *)0x1;
      uVar35 = *(ulong *)pRVar24;
      do {
        pRVar23 = pRVar24;
        if ((uVar35 & 8) != 0) {
          if (pRVar28 != (RayK<4> *)0x0) {
            local_1268._0_8_ = auVar83._0_8_ ^ 0xffffffffffffffff;
            local_1268._8_4_ = auVar83._8_4_ ^ 0xffffffff;
            local_1268._12_4_ = auVar83._12_4_ ^ 0xffffffff;
            local_1078 = *(undefined8 *)ray;
            uStack_1070 = *(undefined8 *)(ray + 8);
            local_1088 = *(undefined8 *)(ray + 0x10);
            uStack_1080 = *(undefined8 *)(ray + 0x18);
            local_1098 = *(undefined8 *)(ray + 0x20);
            uStack_1090 = *(undefined8 *)(ray + 0x28);
            uVar12 = *(undefined8 *)(ray + 0x30);
            uVar13 = *(undefined8 *)(ray + 0x38);
            local_1128 = uVar12;
            uStack_1120 = uVar13;
            uVar14 = *(undefined8 *)(ray + 0x50);
            uVar15 = *(undefined8 *)(ray + 0x58);
            local_10a8 = uVar14;
            uStack_10a0 = uVar15;
            uVar16 = *(undefined8 *)(ray + 0x60);
            uVar17 = *(undefined8 *)(ray + 0x68);
            local_10b8 = uVar16;
            uStack_10b0 = uVar17;
            uVar18 = *(undefined8 *)(ray + 0x40);
            uVar19 = *(undefined8 *)(ray + 0x48);
            local_10c8 = uVar18;
            uStack_10c0 = uVar19;
            uVar20 = *(undefined8 *)(ray + 0x80);
            uVar21 = *(undefined8 *)(ray + 0x88);
            local_1138 = uVar20;
            uStack_1130 = uVar21;
            local_10d8 = *(undefined8 *)(ray + 0x90);
            uStack_10d0 = *(undefined8 *)(ray + 0x98);
            lVar36 = (uVar35 & 0xfffffffffffffff0) + 0x90;
            lVar31 = 0;
            pGVar25 = (Geometry *)ray;
            goto LAB_00edd6c7;
          }
          break;
        }
        pfVar1 = (float *)(uVar35 + 0x20 + uVar29);
        auVar38._0_4_ = (float)local_f98._0_4_ * *pfVar1;
        auVar38._4_4_ = (float)local_f98._4_4_ * pfVar1[1];
        auVar38._8_4_ = fStack_f90 * pfVar1[2];
        auVar38._12_4_ = fStack_f8c * pfVar1[3];
        auVar62 = vsubps_avx(auVar38,local_fa8);
        pfVar1 = (float *)(uVar35 + 0x20 + uVar34);
        auVar53._0_4_ = (float)local_fb8._0_4_ * *pfVar1;
        auVar53._4_4_ = (float)local_fb8._4_4_ * pfVar1[1];
        auVar53._8_4_ = fStack_fb0 * pfVar1[2];
        auVar53._12_4_ = fStack_fac * pfVar1[3];
        auVar51 = vsubps_avx(auVar53,local_fc8);
        auVar62 = vpmaxsd_avx(auVar62,auVar51);
        pfVar1 = (float *)(uVar35 + 0x20 + uVar30);
        auVar54._0_4_ = (float)local_fd8._0_4_ * *pfVar1;
        auVar54._4_4_ = (float)local_fd8._4_4_ * pfVar1[1];
        auVar54._8_4_ = fStack_fd0 * pfVar1[2];
        auVar54._12_4_ = fStack_fcc * pfVar1[3];
        auVar51 = vsubps_avx(auVar54,local_fe8);
        auVar51 = vpmaxsd_avx(auVar51,auVar5);
        auVar62 = vpmaxsd_avx(auVar62,auVar51);
        pfVar1 = (float *)(uVar35 + 0x20 + (uVar29 ^ 0x10));
        auVar55._0_4_ = (float)local_ff8._0_4_ * *pfVar1;
        auVar55._4_4_ = (float)local_ff8._4_4_ * pfVar1[1];
        auVar55._8_4_ = fStack_ff0 * pfVar1[2];
        auVar55._12_4_ = fStack_fec * pfVar1[3];
        auVar51 = vsubps_avx(auVar55,local_1008);
        pfVar1 = (float *)(uVar35 + 0x20 + (uVar34 ^ 0x10));
        auVar69._0_4_ = (float)local_1028._0_4_ * *pfVar1;
        auVar69._4_4_ = (float)local_1028._4_4_ * pfVar1[1];
        auVar69._8_4_ = fStack_1020 * pfVar1[2];
        auVar69._12_4_ = fStack_101c * pfVar1[3];
        auVar61 = vsubps_avx(auVar69,local_1048);
        auVar51 = vpminsd_avx(auVar51,auVar61);
        pfVar1 = (float *)(uVar35 + 0x20 + (uVar30 ^ 0x10));
        auVar70._0_4_ = (float)local_1038._0_4_ * *pfVar1;
        auVar70._4_4_ = (float)local_1038._4_4_ * pfVar1[1];
        auVar70._8_4_ = fStack_1030 * pfVar1[2];
        auVar70._12_4_ = fStack_102c * pfVar1[3];
        auVar61 = vsubps_avx(auVar70,local_1058);
        auVar61 = vpminsd_avx(auVar61,local_1018);
        auVar51 = vpminsd_avx(auVar51,auVar61);
        auVar62 = vcmpps_avx(auVar62,auVar51,2);
        auVar50 = ZEXT1664(auVar62);
        uVar22 = vmovmskps_avx(auVar62);
        if (uVar22 == 0) break;
        uVar32 = (ulong)(uVar22 & 0xff);
        uVar33 = 8;
        pRVar28 = (RayK<4> *)0x0;
        do {
          lVar31 = 0;
          if (uVar32 != 0) {
            for (; (uVar32 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
            }
          }
          uVar2 = *(undefined4 *)(uVar35 + 0x20 + lVar31 * 4);
          auVar39._4_4_ = uVar2;
          auVar39._0_4_ = uVar2;
          auVar39._8_4_ = uVar2;
          auVar39._12_4_ = uVar2;
          auVar62 = vsubps_avx(auVar39,auVar60);
          auVar40._0_4_ = auVar64._0_4_ * auVar62._0_4_;
          auVar40._4_4_ = auVar64._4_4_ * auVar62._4_4_;
          auVar40._8_4_ = auVar64._8_4_ * auVar62._8_4_;
          auVar40._12_4_ = auVar64._12_4_ * auVar62._12_4_;
          uVar2 = *(undefined4 *)(uVar35 + 0x40 + lVar31 * 4);
          auVar56._4_4_ = uVar2;
          auVar56._0_4_ = uVar2;
          auVar56._8_4_ = uVar2;
          auVar56._12_4_ = uVar2;
          auVar62 = vsubps_avx(auVar56,auVar3);
          auVar57._0_4_ = auVar66._0_4_ * auVar62._0_4_;
          auVar57._4_4_ = auVar66._4_4_ * auVar62._4_4_;
          auVar57._8_4_ = auVar66._8_4_ * auVar62._8_4_;
          auVar57._12_4_ = auVar66._12_4_ * auVar62._12_4_;
          uVar2 = *(undefined4 *)(uVar35 + 0x60 + lVar31 * 4);
          auVar71._4_4_ = uVar2;
          auVar71._0_4_ = uVar2;
          auVar71._8_4_ = uVar2;
          auVar71._12_4_ = uVar2;
          auVar62 = vsubps_avx(auVar71,auVar4);
          auVar72._0_4_ = auVar68._0_4_ * auVar62._0_4_;
          auVar72._4_4_ = auVar68._4_4_ * auVar62._4_4_;
          auVar72._8_4_ = auVar68._8_4_ * auVar62._8_4_;
          auVar72._12_4_ = auVar68._12_4_ * auVar62._12_4_;
          uVar2 = *(undefined4 *)(uVar35 + 0x30 + lVar31 * 4);
          auVar77._4_4_ = uVar2;
          auVar77._0_4_ = uVar2;
          auVar77._8_4_ = uVar2;
          auVar77._12_4_ = uVar2;
          auVar62 = vsubps_avx(auVar77,auVar60);
          auVar78._0_4_ = auVar62._0_4_ * auVar64._0_4_;
          auVar78._4_4_ = auVar62._4_4_ * auVar64._4_4_;
          auVar78._8_4_ = auVar62._8_4_ * auVar64._8_4_;
          auVar78._12_4_ = auVar62._12_4_ * auVar64._12_4_;
          uVar2 = *(undefined4 *)(uVar35 + 0x50 + lVar31 * 4);
          auVar84._4_4_ = uVar2;
          auVar84._0_4_ = uVar2;
          auVar84._8_4_ = uVar2;
          auVar84._12_4_ = uVar2;
          auVar62 = vsubps_avx(auVar84,auVar3);
          auVar85._0_4_ = auVar62._0_4_ * auVar66._0_4_;
          auVar85._4_4_ = auVar62._4_4_ * auVar66._4_4_;
          auVar85._8_4_ = auVar62._8_4_ * auVar66._8_4_;
          auVar85._12_4_ = auVar62._12_4_ * auVar66._12_4_;
          uVar2 = *(undefined4 *)(uVar35 + 0x70 + lVar31 * 4);
          auVar88._4_4_ = uVar2;
          auVar88._0_4_ = uVar2;
          auVar88._8_4_ = uVar2;
          auVar88._12_4_ = uVar2;
          auVar62 = vsubps_avx(auVar88,auVar4);
          auVar89._0_4_ = auVar68._0_4_ * auVar62._0_4_;
          auVar89._4_4_ = auVar68._4_4_ * auVar62._4_4_;
          auVar89._8_4_ = auVar68._8_4_ * auVar62._8_4_;
          auVar89._12_4_ = auVar68._12_4_ * auVar62._12_4_;
          auVar62 = vpminsd_avx(auVar40,auVar78);
          auVar51 = vpminsd_avx(auVar57,auVar85);
          auVar62 = vpmaxsd_avx(auVar62,auVar51);
          auVar52 = vpminsd_avx(auVar72,auVar89);
          auVar51 = vpmaxsd_avx(auVar40,auVar78);
          auVar61 = vpmaxsd_avx(auVar57,auVar85);
          auVar63 = vpminsd_avx(auVar51,auVar61);
          auVar51 = vpmaxsd_avx(auVar72,auVar89);
          auVar61 = vpmaxsd_avx(auVar52,local_f88);
          auVar62 = vpmaxsd_avx(auVar62,auVar61);
          auVar51 = vpminsd_avx(auVar51,auVar37);
          auVar51 = vpminsd_avx(auVar63,auVar51);
          auVar62 = vcmpps_avx(auVar62,auVar51,2);
          auVar50 = ZEXT1664(auVar62);
          uVar22 = vmovmskps_avx(auVar62);
          if (uVar22 != 0) {
            uVar7 = *(ulong *)(uVar35 + lVar31 * 8);
            if (uVar33 != 8) {
              *(ulong *)pRVar24 = uVar33;
              *(RayK<4> **)(pRVar24 + 8) = pRVar28;
              pRVar24 = pRVar24 + 0x10;
            }
            pRVar28 = (RayK<4> *)(ulong)(uVar22 & 0xff);
            uVar33 = uVar7;
          }
          auVar83 = ZEXT1664(auVar49);
          uVar32 = uVar32 & uVar32 - 1;
        } while (uVar32 != 0);
        pRVar23 = pRVar24;
        uVar35 = uVar33;
      } while (uVar33 != 8);
    }
  } while( true );
LAB_00edd6c7:
  do {
    auVar62 = auVar83._0_16_;
    if (lVar31 == (ulong)((uint)uVar35 & 0xf) - 8) break;
    pRVar28 = (RayK<4> *)&DAT_fffffffffffffff0;
    auVar51 = local_1268;
    do {
      if (pRVar28 == (RayK<4> *)0x0) break;
      pGVar25 = (Geometry *)0x0;
      if ((ulong)*(uint *)(pRVar28 + lVar36 + 0x10) == 0xffffffff) break;
      uVar26 = *(undefined4 *)(pRVar28 + lVar36 + -0x80);
      auVar41._4_4_ = uVar26;
      auVar41._0_4_ = uVar26;
      auVar41._8_4_ = uVar26;
      auVar41._12_4_ = uVar26;
      auVar52 = vsubps_avx(auVar41,*(undefined1 (*) [16])ray);
      uVar26 = *(undefined4 *)(pRVar28 + lVar36 + -0x70);
      auVar42._4_4_ = uVar26;
      auVar42._0_4_ = uVar26;
      auVar42._8_4_ = uVar26;
      auVar42._12_4_ = uVar26;
      auVar63 = vsubps_avx(auVar42,*(undefined1 (*) [16])(ray + 0x10));
      uVar26 = *(undefined4 *)(pRVar28 + lVar36 + -0x60);
      auVar43._4_4_ = uVar26;
      auVar43._0_4_ = uVar26;
      auVar43._8_4_ = uVar26;
      auVar43._12_4_ = uVar26;
      auVar65 = vsubps_avx(auVar43,*(undefined1 (*) [16])(ray + 0x20));
      local_10e8 = *(float *)(pRVar28 + lVar36 + -0x50);
      local_10f8 = *(float *)(pRVar28 + lVar36 + -0x40);
      local_1108 = *(float *)(pRVar28 + lVar36 + -0x30);
      fVar8 = *(float *)(pRVar28 + lVar36 + -0x20);
      fVar9 = *(float *)(pRVar28 + lVar36 + -0x10);
      fVar10 = *(float *)(pRVar28 + lVar36);
      fStack_1104 = local_1108;
      fStack_1100 = local_1108;
      fStack_10fc = local_1108;
      auVar62 = ZEXT416((uint)(local_10e8 * fVar10 - local_1108 * fVar8));
      auVar62 = vshufps_avx(auVar62,auVar62,0);
      fStack_10e4 = local_10e8;
      fStack_10e0 = local_10e8;
      fStack_10dc = local_10e8;
      fStack_10f4 = local_10f8;
      fStack_10f0 = local_10f8;
      fStack_10ec = local_10f8;
      auVar61 = ZEXT416((uint)(fVar8 * local_10f8 - local_10e8 * fVar9));
      auVar61 = vshufps_avx(auVar61,auVar61,0);
      local_10a8._0_4_ = (float)uVar14;
      local_10a8._4_4_ = (float)((ulong)uVar14 >> 0x20);
      uStack_10a0._0_4_ = (float)uVar15;
      uStack_10a0._4_4_ = (float)((ulong)uVar15 >> 0x20);
      local_11a8 = auVar65._0_4_;
      fStack_11a4 = auVar65._4_4_;
      fStack_11a0 = auVar65._8_4_;
      fStack_119c = auVar65._12_4_;
      auVar44._0_4_ = local_11a8 * (float)local_10a8;
      auVar44._4_4_ = fStack_11a4 * local_10a8._4_4_;
      auVar44._8_4_ = fStack_11a0 * (float)uStack_10a0;
      auVar44._12_4_ = fStack_119c * uStack_10a0._4_4_;
      local_10b8._0_4_ = (float)uVar16;
      local_10b8._4_4_ = (float)((ulong)uVar16 >> 0x20);
      uStack_10b0._0_4_ = (float)uVar17;
      uStack_10b0._4_4_ = (float)((ulong)uVar17 >> 0x20);
      local_1198 = auVar63._0_4_;
      fStack_1194 = auVar63._4_4_;
      fStack_1190 = auVar63._8_4_;
      fStack_118c = auVar63._12_4_;
      auVar95._0_4_ = local_1198 * (float)local_10b8;
      auVar95._4_4_ = fStack_1194 * local_10b8._4_4_;
      auVar95._8_4_ = fStack_1190 * (float)uStack_10b0;
      auVar95._12_4_ = fStack_118c * uStack_10b0._4_4_;
      local_1068 = vsubps_avx(auVar95,auVar44);
      local_1188 = auVar52._0_4_;
      fStack_1184 = auVar52._4_4_;
      fStack_1180 = auVar52._8_4_;
      fStack_117c = auVar52._12_4_;
      local_1248._4_4_ = fStack_1184 * local_10b8._4_4_;
      local_1248._0_4_ = local_1188 * (float)local_10b8;
      fStack_1240 = fStack_1180 * (float)uStack_10b0;
      fStack_123c = fStack_117c * uStack_10b0._4_4_;
      local_10c8._0_4_ = (float)uVar18;
      local_10c8._4_4_ = (float)((ulong)uVar18 >> 0x20);
      uStack_10c0._0_4_ = (float)uVar19;
      uStack_10c0._4_4_ = (float)((ulong)uVar19 >> 0x20);
      auVar96._0_4_ = local_11a8 * (float)local_10c8;
      auVar96._4_4_ = fStack_11a4 * local_10c8._4_4_;
      auVar96._8_4_ = fStack_11a0 * (float)uStack_10c0;
      auVar96._12_4_ = fStack_119c * uStack_10c0._4_4_;
      auVar52 = vsubps_avx(auVar96,_local_1248);
      auVar79._0_4_ = local_1198 * (float)local_10c8;
      auVar79._4_4_ = fStack_1194 * local_10c8._4_4_;
      auVar79._8_4_ = fStack_1190 * (float)uStack_10c0;
      auVar79._12_4_ = fStack_118c * uStack_10c0._4_4_;
      auVar97._0_4_ = local_1188 * (float)local_10a8;
      auVar97._4_4_ = fStack_1184 * local_10a8._4_4_;
      auVar97._8_4_ = fStack_1180 * (float)uStack_10a0;
      auVar97._12_4_ = fStack_117c * uStack_10a0._4_4_;
      auVar63 = vsubps_avx(auVar97,auVar79);
      local_11b8 = auVar62._0_4_;
      fStack_11b4 = auVar62._4_4_;
      fStack_11b0 = auVar62._8_4_;
      fStack_11ac = auVar62._12_4_;
      auVar67 = ZEXT816(0) << 0x20;
      local_1118 = vpermilps_avx(ZEXT416((uint)(local_1108 * fVar9 - fVar10 * local_10f8)),0);
      auVar58._0_4_ =
           local_1118._0_4_ * (float)local_10c8 +
           (float)local_10a8 * local_11b8 + auVar61._0_4_ * (float)local_10b8;
      auVar58._4_4_ =
           local_1118._4_4_ * local_10c8._4_4_ +
           local_10a8._4_4_ * fStack_11b4 + auVar61._4_4_ * local_10b8._4_4_;
      auVar58._8_4_ =
           local_1118._8_4_ * (float)uStack_10c0 +
           (float)uStack_10a0 * fStack_11b0 + auVar61._8_4_ * (float)uStack_10b0;
      auVar58._12_4_ =
           local_1118._12_4_ * uStack_10c0._4_4_ +
           uStack_10a0._4_4_ * fStack_11ac + auVar61._12_4_ * uStack_10b0._4_4_;
      auVar80._8_4_ = 0x80000000;
      auVar80._0_8_ = 0x8000000080000000;
      auVar80._12_4_ = 0x80000000;
      auVar62 = vandps_avx(auVar80,auVar58);
      uVar22 = auVar62._0_4_;
      auVar81._0_4_ =
           uVar22 ^ (uint)(local_1068._0_4_ * fVar8 + auVar63._0_4_ * fVar10 + auVar52._0_4_ * fVar9
                          );
      uVar91 = auVar62._4_4_;
      auVar81._4_4_ =
           uVar91 ^ (uint)(local_1068._4_4_ * fVar8 + auVar63._4_4_ * fVar10 + auVar52._4_4_ * fVar9
                          );
      uVar92 = auVar62._8_4_;
      auVar81._8_4_ =
           uVar92 ^ (uint)(local_1068._8_4_ * fVar8 + auVar63._8_4_ * fVar10 + auVar52._8_4_ * fVar9
                          );
      uVar93 = auVar62._12_4_;
      auVar81._12_4_ =
           uVar93 ^ (uint)(local_1068._12_4_ * fVar8 +
                          auVar63._12_4_ * fVar10 + auVar52._12_4_ * fVar9);
      auVar62 = vcmpps_avx(auVar81,auVar67,5);
      auVar65 = auVar51 & auVar62;
      auVar86._8_8_ = mm_lookupmask_ps._8_8_;
      auVar86._0_8_ = mm_lookupmask_ps._0_8_;
      if ((((auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar65[0xf] < '\0'
         ) {
        auVar62 = vandps_avx(auVar51,auVar62);
        auVar59._0_4_ =
             uVar22 ^ (uint)(local_1068._0_4_ * local_10e8 +
                            auVar52._0_4_ * local_10f8 + auVar63._0_4_ * local_1108);
        auVar59._4_4_ =
             uVar91 ^ (uint)(local_1068._4_4_ * local_10e8 +
                            auVar52._4_4_ * local_10f8 + auVar63._4_4_ * local_1108);
        auVar59._8_4_ =
             uVar92 ^ (uint)(local_1068._8_4_ * local_10e8 +
                            auVar52._8_4_ * local_10f8 + auVar63._8_4_ * local_1108);
        auVar59._12_4_ =
             uVar93 ^ (uint)(local_1068._12_4_ * local_10e8 +
                            auVar52._12_4_ * local_10f8 + auVar63._12_4_ * local_1108);
        auVar52 = vcmpps_avx(auVar59,auVar67,5);
        auVar63 = auVar62 & auVar52;
        if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar63[0xf] < '\0') {
          auVar46._8_4_ = 0x7fffffff;
          auVar46._0_8_ = 0x7fffffff7fffffff;
          auVar46._12_4_ = 0x7fffffff;
          auVar63 = vandps_avx(auVar46,auVar58);
          auVar62 = vandps_avx(auVar52,auVar62);
          auVar52 = vsubps_avx(auVar63,auVar81);
          auVar52 = vcmpps_avx(auVar52,auVar59,5);
          auVar65 = auVar62 & auVar52;
          if ((((auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar65[0xf] < '\0') {
            auVar62 = vandps_avx(auVar62,auVar52);
            auVar73._0_4_ =
                 uVar22 ^ (uint)(local_1118._0_4_ * local_1188 +
                                local_11b8 * local_1198 + auVar61._0_4_ * local_11a8);
            auVar73._4_4_ =
                 uVar91 ^ (uint)(local_1118._4_4_ * fStack_1184 +
                                fStack_11b4 * fStack_1194 + auVar61._4_4_ * fStack_11a4);
            auVar73._8_4_ =
                 uVar92 ^ (uint)(local_1118._8_4_ * fStack_1180 +
                                fStack_11b0 * fStack_1190 + auVar61._8_4_ * fStack_11a0);
            auVar73._12_4_ =
                 uVar93 ^ (uint)(local_1118._12_4_ * fStack_117c +
                                fStack_11ac * fStack_118c + auVar61._12_4_ * fStack_119c);
            local_1128._0_4_ = (float)uVar12;
            local_1128._4_4_ = (float)((ulong)uVar12 >> 0x20);
            uStack_1120._0_4_ = (float)uVar13;
            uStack_1120._4_4_ = (float)((ulong)uVar13 >> 0x20);
            auVar82._0_4_ = auVar63._0_4_ * (float)local_1128;
            auVar82._4_4_ = auVar63._4_4_ * local_1128._4_4_;
            auVar82._8_4_ = auVar63._8_4_ * (float)uStack_1120;
            auVar82._12_4_ = auVar63._12_4_ * uStack_1120._4_4_;
            auVar61 = vcmpps_avx(auVar82,auVar73,1);
            local_1138._0_4_ = (float)uVar20;
            local_1138._4_4_ = (float)((ulong)uVar20 >> 0x20);
            uStack_1130._0_4_ = (float)uVar21;
            uStack_1130._4_4_ = (float)((ulong)uVar21 >> 0x20);
            auVar47._0_4_ = auVar63._0_4_ * (float)local_1138;
            auVar47._4_4_ = auVar63._4_4_ * local_1138._4_4_;
            auVar47._8_4_ = auVar63._8_4_ * (float)uStack_1130;
            auVar47._12_4_ = auVar63._12_4_ * uStack_1130._4_4_;
            auVar52 = vcmpps_avx(auVar73,auVar47,2);
            auVar61 = vandps_avx(auVar61,auVar52);
            auVar52 = auVar62 & auVar61;
            if ((((auVar52 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar52 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar52 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar52[0xf] < '\0') {
              auVar62 = vandps_avx(auVar61,auVar62);
              auVar61 = vcmpps_avx(auVar67,auVar58,4);
              auVar52 = auVar62 & auVar61;
              if ((((auVar52 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar52 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar52 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar52[0xf]) {
              }
              else {
                auVar86 = vandps_avx(auVar61,auVar62);
              }
            }
          }
        }
      }
      pGVar25 = (context->scene->geometries).items[*(uint *)(pRVar28 + lVar36 + 0x10)].ptr;
      uVar22 = pGVar25->mask;
      auVar45._4_4_ = uVar22;
      auVar45._0_4_ = uVar22;
      auVar45._8_4_ = uVar22;
      auVar45._12_4_ = uVar22;
      auVar62 = vandps_avx(auVar45,*(undefined1 (*) [16])(ray + 0x90));
      auVar62 = vpcmpeqd_avx(auVar67,auVar62);
      auVar61 = auVar86 & ~auVar62;
      if ((((auVar61 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar61 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar61 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar61[0xf] < '\0'
         ) {
        auVar62 = vandnps_avx(auVar62,auVar86);
        auVar51 = vandnps_avx(auVar62,auVar51);
      }
      auVar83 = ZEXT1664(auVar49);
      pRVar28 = pRVar28 + 4;
    } while ((((auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             auVar51[0xf] < '\0');
    auVar62 = auVar83._0_16_;
    auVar61 = vandps_avx(auVar51,local_1268);
    lVar31 = lVar31 + 1;
    lVar36 = lVar36 + 0xb0;
    auVar51 = local_1268 & auVar51;
    local_1268 = auVar61;
  } while ((((auVar51 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
            (auVar51 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar51 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           auVar51[0xf] < '\0');
  auVar48._0_8_ = local_1268._0_8_ ^ 0xffffffffffffffff;
  auVar48._8_4_ = local_1268._8_4_ ^ 0xffffffff;
  auVar48._12_4_ = local_1268._12_4_ ^ 0xffffffff;
  auVar51 = vorps_avx(auVar62,auVar48);
  auVar83 = ZEXT1664(auVar51);
  auVar49 = local_11c8 & ~auVar51;
  auVar62 = local_11c8;
  if ((((auVar49 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar49 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar49 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar49[0xf])
  goto LAB_00eddaae;
  local_11c8 = vandnps_avx(auVar51,local_11c8);
  auVar49._8_4_ = 0xff800000;
  auVar49._0_8_ = 0xff800000ff800000;
  auVar49._12_4_ = 0xff800000;
  auVar37 = vblendvps_avx(auVar37,auVar49,auVar51);
  goto LAB_00edd3ed;
LAB_00eddaae:
  if (uVar27 == 0) {
    auVar37 = vpcmpeqd_avx(auVar62,auVar62);
    auVar37 = vpcmpeqd_avx(auVar37,(undefined1  [16])local_1168);
    auVar37 = vpand_avx(auVar83._0_16_,auVar37);
    auVar60._8_4_ = 0xff800000;
    auVar60._0_8_ = 0xff800000ff800000;
    auVar60._12_4_ = 0xff800000;
    auVar37 = vmaskmovps_avx(auVar37,auVar60);
    *(undefined1 (*) [16])(ray + 0x80) = auVar37;
    return;
  }
  goto LAB_00edd086;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occludedCoherent(vint<K>* __restrict__ valid_i,
                                                                                                      Accel::Intersectors* __restrict__ This,
                                                                                                      RayK<K>& __restrict__ ray,
                                                                                                      RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid,ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vbool<K> terminated = !valid;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar,  vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemMaskT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemMaskT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].mask = movemask(octant_valid);

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node of active rays have already been terminated */
          size_t m_active = (size_t)stackPtr->mask & (~(size_t)movemask(terminated));

          if (unlikely(m_active == 0)) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            m_active = 0;

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            //size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const NodeRef child = node->child(i);
                assert(child != BVH::emptyNode);
                BVHN<N>::prefetch(child);
                if (likely(cur != BVH::emptyNode)) {
                  //num_child_hits++;
                  stackPtr->ptr  = cur;
                  stackPtr->mask = m_active;
                  stackPtr++;
                }
                cur = child;
                m_active = movemask(lhit);
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
#if defined(__AVX__)
          STAT3(normal.trav_leaves, 1, popcnt(m_active), K);
#endif
          if (unlikely(!m_active)) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
          octant_valid &= !terminated;
          if (unlikely(none(octant_valid))) break;
          tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

          if (unlikely(lazy_node)) {
            stackPtr->ptr  = lazy_node;
            stackPtr->mask = movemask(octant_valid);
            stackPtr++;
          }
        }
      } while(valid_bits);

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }